

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O3

void __thiscall
duckdb::TextTreeRenderer::RenderTopLayer
          (TextTreeRenderer *this,RenderTree *root,ostream *ss,idx_t y)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  idx_t x;
  char *pcVar5;
  ulong x_00;
  long lVar6;
  allocator local_79;
  string local_78;
  string local_58;
  idx_t local_38;
  
  local_38 = y;
  if (root->width != 0) {
    x_00 = 0;
    do {
      if ((this->config).maximum_render_width <= (this->config).node_render_width * x_00) break;
      bVar2 = RenderTree::HasNode(root,x_00,local_38);
      if (bVar2) {
        pcVar5 = (this->config).LTCORNER;
        iVar1 = (int)ss;
        if (pcVar5 == (char *)0x0) {
          ::std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)ss + -0x18));
        }
        else {
          sVar3 = strlen(pcVar5);
          ::std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar5,sVar3);
        }
        ::std::__cxx11::string::string((string *)&local_58,(this->config).HORIZONTAL,&local_79);
        StringUtil::Repeat(&local_78,&local_58,((this->config).node_render_width >> 1) - 1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (ss,(char *)CONCAT71(local_78._M_dataplus._M_p._1_7_,
                                       local_78._M_dataplus._M_p._0_1_),local_78._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_))
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if (local_38 == 0) {
          pcVar5 = (this->config).HORIZONTAL;
        }
        else {
          pcVar5 = (this->config).DMIDDLE;
        }
        if (pcVar5 == (char *)0x0) {
          ::std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)ss + -0x18));
        }
        else {
          sVar3 = strlen(pcVar5);
          ::std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar5,sVar3);
        }
        ::std::__cxx11::string::string((string *)&local_58,(this->config).HORIZONTAL,&local_79);
        StringUtil::Repeat(&local_78,&local_58,((this->config).node_render_width >> 1) - 1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (ss,(char *)CONCAT71(local_78._M_dataplus._M_p._1_7_,
                                       local_78._M_dataplus._M_p._0_1_),local_78._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_))
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        pcVar5 = (this->config).RTCORNER;
        if (pcVar5 == (char *)0x0) {
          ::std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)ss + -0x18));
        }
        else {
          sVar3 = strlen(pcVar5);
          ::std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar5,sVar3);
        }
      }
      else {
        uVar4 = root->width;
        if (x_00 < uVar4) {
          lVar6 = 0;
          bVar2 = false;
          do {
            x = lVar6 + x_00;
            while (lVar6 = lVar6 + 1, bVar2 != false) {
              x = x + 1;
              bVar2 = true;
              if (uVar4 <= x) goto LAB_00ac521c;
            }
            bVar2 = RenderTree::HasNode(root,x,local_38);
            uVar4 = root->width;
          } while (x + 1 < uVar4);
          if (bVar2) {
LAB_00ac521c:
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58," ","");
            StringUtil::Repeat(&local_78,&local_58,(this->config).node_render_width);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (ss,(char *)CONCAT71(local_78._M_dataplus._M_p._1_7_,
                                           local_78._M_dataplus._M_p._0_1_),
                       local_78._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
                &local_78.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_78._M_dataplus._M_p._1_7_,
                                       local_78._M_dataplus._M_p._0_1_));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
          }
        }
      }
      x_00 = x_00 + 1;
    } while (x_00 < root->width);
  }
  local_78._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>(ss,(char *)&local_78,1);
  return;
}

Assistant:

void TextTreeRenderer::RenderTopLayer(RenderTree &root, std::ostream &ss, idx_t y) {
	for (idx_t x = 0; x < root.width; x++) {
		if (x * config.node_render_width >= config.maximum_render_width) {
			break;
		}
		if (root.HasNode(x, y)) {
			ss << config.LTCORNER;
			ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2 - 1);
			if (y == 0) {
				// top level node: no node above this one
				ss << config.HORIZONTAL;
			} else {
				// render connection to node above this one
				ss << config.DMIDDLE;
			}
			ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2 - 1);
			ss << config.RTCORNER;
		} else {
			bool has_adjacent_nodes = false;
			for (idx_t i = 0; x + i < root.width; i++) {
				has_adjacent_nodes = has_adjacent_nodes || root.HasNode(x + i, y);
			}
			if (!has_adjacent_nodes) {
				// There are no nodes to the right side of this position
				// no need to fill the empty space
				continue;
			}
			// there are nodes next to this, fill the space
			ss << StringUtil::Repeat(" ", config.node_render_width);
		}
	}
	ss << '\n';
}